

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

iterator __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::begin(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
        *this)

{
  iterator iVar1;
  bool bVar2;
  pointer ptr;
  pointer poVar3;
  size_t sVar4;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  *in_RDI;
  Iterator iter;
  byte local_31;
  Iterator local_10;
  
  ptr = pstd::
        vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
        ::data(in_RDI);
  poVar3 = pstd::
           vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
           ::data(in_RDI);
  sVar4 = pstd::
          vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
          ::size(in_RDI);
  Iterator::Iterator(&local_10,ptr,poVar3 + sVar4);
  while( true ) {
    local_31 = 0;
    if (local_10.ptr < local_10.end) {
      bVar2 = pstd::optional<std::pair<int,_int>_>::has_value(local_10.ptr);
      local_31 = bVar2 ^ 0xff;
    }
    if ((local_31 & 1) == 0) break;
    local_10.ptr = local_10.ptr + 1;
  }
  iVar1.end = local_10.end;
  iVar1.ptr = local_10.ptr;
  return iVar1;
}

Assistant:

PBRT_CPU_GPU
    iterator begin() {
        Iterator iter(table.data(), table.data() + table.size());
        while (iter.ptr < iter.end && !iter.ptr->has_value())
            ++iter.ptr;
        return iter;
    }